

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

HelicsBool helicsDataBufferToBoolean(HelicsDataBuffer data)

{
  SmallBuffer *this;
  bool val;
  SmallBuffer *ptr;
  bool *in_stack_00000110;
  DataType in_stack_0000011c;
  data_view *in_stack_00000120;
  HelicsDataBuffer in_stack_ffffffffffffffa8;
  SmallBuffer *in_stack_ffffffffffffffb8;
  data_view *in_stack_ffffffffffffffc0;
  byte local_19;
  uint local_4;
  
  this = getBuffer(in_stack_ffffffffffffffa8);
  if (this == (SmallBuffer *)0x0) {
    local_4 = 0;
  }
  else {
    helics::data_view::data_view(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    helics::SmallBuffer::data(this);
    helics::detail::detectType((byte *)in_stack_ffffffffffffffb8);
    helics::valueExtract(in_stack_00000120,in_stack_0000011c,in_stack_00000110);
    helics::data_view::~data_view((data_view *)0x1f408c);
    local_4 = (uint)((local_19 & 1) != 0);
  }
  return local_4;
}

Assistant:

HelicsBool helicsDataBufferToBoolean(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return HELICS_FALSE;
    }
    bool val;
    helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), val);
    return (val) ? HELICS_TRUE : HELICS_FALSE;
}